

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Fire_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Fire_PDU *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_240;
  string local_220 [32];
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Fire PDU-\n");
  Warfare_Header::GetAsString_abi_cxx11_(&local_1e0,&this->super_Warfare_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"Fire Mission Index:  ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"World Location:      ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_200,&this->m_Location);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  (*(((this->m_pDescriptor).m_pRef)->super_DataTypeBase)._vptr_DataTypeBase[2])(local_220);
  poVar1 = std::operator<<(poVar1,local_220);
  poVar1 = std::operator<<(poVar1,"Velocity:            ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_240,&this->m_Velocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"Range:               ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Range);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Fire_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Fire PDU-\n"
       << Warfare_Header::GetAsString()
       << "Fire Mission Index:  " << m_ui32FireMissionIndex  << "\n"
       << "World Location:      " << m_Location.GetAsString()
       << m_pDescriptor->GetAsString()
       << "Velocity:            " << m_Velocity.GetAsString()
       << "Range:               " << m_f32Range             << "\n";

    return ss.str();
}